

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O0

void __thiscall Clasp::Asp::PrgBody::~PrgBody(PrgBody *this)

{
  bool bVar1;
  PrgBody *in_stack_ffffffffffffffe0;
  
  clearHeads(in_stack_ffffffffffffffe0);
  bVar1 = hasWeights(in_stack_ffffffffffffffe0);
  if (bVar1) {
    sumData((PrgBody *)0x1a242e);
    SumData::destroy((SumData *)0x1a243f);
  }
  return;
}

Assistant:

PrgBody::~PrgBody() {
	clearHeads();
	if (hasWeights()) {
		sumData()->destroy();
	}
}